

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O2

HRESULT __thiscall
Js::SourceTextModuleRecord::PrepareForModuleDeclarationInitialization(SourceTextModuleRecord *this)

{
  JavascriptPromise *pJVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  void *__frameAddr;
  undefined1 local_58 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  pcVar7 = GetSpecifierSz(this);
  iVar6 = 0;
  Output::TraceWithFlush(ModulePhase,L"PrepareForModuleDeclarationInitialization(%s)\n",pcVar7);
  bVar4 = ConfirmChildrenParsed(this);
  if (bVar4) {
    iVar6 = 0;
    Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentsAsNeeded\n");
    NotifyParentsAsNeeded(this);
    if ((this->wasDeclarationInitialized == false) &&
       (pJVar1 = (this->promise).ptr, (pJVar1 != (JavascriptPromise *)0x0 | this->isRootModule) == 1
       )) {
      scriptContext = (this->scriptContext).ptr;
      if ((pJVar1 == (JavascriptPromise *)0x0 & scriptContext->threadContext->isScriptActive) == 1)
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x179,
                                    "(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr)"
                                    ,
                                    "!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr"
                                   );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      iVar5 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])(this);
      if ((char)iVar5 != '\0') {
        (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0xb])(this);
      }
      if ((this->errorObject).ptr != (void *)0x0) {
        ReleaseParserResourcesForHierarchy(this);
      }
      if ((this->hadNotifyHostReady == false) &&
         ((this->super_ModuleRecordBase).wasEvaluated == false)) {
        pcVar7 = GetSpecifierSz(this);
        Output::TraceWithFlush
                  (ModulePhase,
                   L"\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"
                   ,pcVar7);
        if (scriptContext->threadContext->isScriptActive == true) {
          LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_58,scriptContext,
                     &stack0xfffffffffffffff8);
          pTVar2 = scriptContext->threadContext;
          bVar4 = pTVar2->reentrancySafeOrHandled;
          pTVar2->reentrancySafeOrHandled = true;
          iVar6 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
          pTVar2->reentrancySafeOrHandled = bVar4;
          LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                    ((LeaveScriptObject<true,_true,_false> *)local_58);
        }
        else {
          local_58._0_4_ = ExceptionCheck::Save();
          iVar6 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                            (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
          ExceptionCheck::Restore((Data *)local_58);
        }
        this->hadNotifyHostReady = true;
      }
    }
  }
  return iVar6;
}

Assistant:

HRESULT SourceTextModuleRecord::PrepareForModuleDeclarationInitialization()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("PrepareForModuleDeclarationInitialization(%s)\n"), this->GetSpecifierSz());
        HRESULT hr = NO_ERROR;

        if (ConfirmChildrenParsed())
        {
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentsAsNeeded\n"));
            NotifyParentsAsNeeded();

            if (!WasDeclarationInitialized() && (isRootModule || promise != nullptr))
            {
                // TODO: move this as a promise call? if parser is called from a different thread
                // We'll need to call the bytecode gen in the main thread as we are accessing GC.
                ScriptContext* scriptContext = GetScriptContext();
                Assert(!scriptContext->GetThreadContext()->IsScriptActive() || this->promise != nullptr);

                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                }

                if (!hadNotifyHostReady && !WasEvaluated())
                {
                    OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PrepareForModuleDeclarationInitialization)\n"), this->GetSpecifierSz());
                    LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                    {
                        hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                    });

                    hadNotifyHostReady = true;
                }
            }
        }
        return hr;
    }